

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

uint16_t mipsdsp_sat16_lshift(uint16_t a,uint8_t s,CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  undefined3 in_register_00000031;
  uint uVar2;
  
  if (CONCAT31(in_register_00000031,s) != 0) {
    if ((short)a < 0) {
      uVar2 = ~(-1 << (s & 0x1f)) & (uint)(a >> (0xf - s & 0x1f)) |
              ~(-1 << (0x10 - s & 0x1f)) << (s & 0x1f);
    }
    else {
      uVar2 = (uint)(a >> (0xf - s & 0x1f));
    }
    if (((short)uVar2 != 0) && ((uVar2 & 0xffff) != 0xffff)) {
      pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
      *pbVar1 = *pbVar1 | 0x40;
      return 0x7fff - ((short)a >> 0xf);
    }
    a = a << (s & 0x1f);
  }
  return a;
}

Assistant:

static inline uint16_t mipsdsp_sat16_lshift(uint16_t a, uint8_t s,
                                            CPUMIPSState *env)
{
    uint8_t  sign;
    uint16_t discard;

    if (s == 0) {
        return a;
    } else {
        sign = (a >> 15) & 0x01;
        if (sign != 0) {
            discard = (((0x01 << (16 - s)) - 1) << s) |
                      ((a >> (14 - (s - 1))) & ((0x01 << s) - 1));
        } else {
            discard = a >> (14 - (s - 1));
        }

        if ((discard != 0x0000) && (discard != 0xFFFF)) {
            set_DSPControl_overflow_flag(1, 22, env);
            return (sign == 0) ? 0x7FFF : 0x8000;
        } else {
            return a << s;
        }
    }
}